

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O3

void __thiscall DCeiling::Serialize(DCeiling *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  type val;
  type_conflict val_1;
  ECeiling local_20;
  ECrushMode local_1c;
  
  DMover::Serialize((DMover *)this,arc);
  local_20 = this->m_Type;
  ::Serialize(arc,"type",&local_20,(uint32_t *)0x0);
  this->m_Type = local_20;
  pFVar1 = ::Serialize(arc,"bottomheight",&this->m_BottomHeight,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"topheight",&this->m_TopHeight,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"speed",&this->m_Speed,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"speed1",&this->m_Speed1,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"speed2",&this->m_Speed2,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"crush",&this->m_Crush,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"silent",&this->m_Silent,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"direction",&this->m_Direction,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"texture",&this->m_Texture,(FTextureID *)0x0);
  pFVar1 = ::Serialize(pFVar1,"newspecial",&this->m_NewSpecial,(secspecial_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"tag",&this->m_Tag,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"olddirecton",&this->m_OldDirection,(int32_t *)0x0);
  local_1c = this->m_CrushMode;
  ::Serialize(pFVar1,"crushmode",(int32_t *)&local_1c,(int32_t *)0x0);
  this->m_CrushMode = local_1c;
  return;
}

Assistant:

void DCeiling::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("bottomheight", m_BottomHeight)
		("topheight", m_TopHeight)
		("speed", m_Speed)
		("speed1", m_Speed1)
		("speed2", m_Speed2)
		("crush", m_Crush)
		("silent", m_Silent)
		("direction", m_Direction)
		("texture", m_Texture)
		("newspecial", m_NewSpecial)
		("tag", m_Tag)
		("olddirecton", m_OldDirection)
		.Enum("crushmode", m_CrushMode);
}